

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O1

string * __thiscall
cmOutputConverter::EscapeForShell_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,string_view str,bool makeVars,
          bool forEcho,bool useWatcomQuote,bool unescapeNinjaConfiguration,bool forResponse)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  const_iterator cVar5;
  cmState *pcVar6;
  char *pcVar7;
  cmOutputConverter *this_00;
  int flags;
  undefined7 in_register_00000081;
  allocator_type *__a;
  string_view in;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  allocator_type local_102;
  less<std::basic_string_view<char,_std::char_traits<char>_>_> local_101;
  key_type local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f0 [12];
  
  flags = (int)CONCAT71(in_register_00000081,makeVars);
  pcVar7 = str._M_str;
  this_00 = (cmOutputConverter *)str._M_len;
  local_100._M_len = (size_t)this_00;
  local_100._M_str = pcVar7;
  if (cmOutputConverterIsShellOperator(std::basic_string_view<char,std::char_traits<char>>)::
      shellOperators == '\0') {
    iVar4 = __cxa_guard_acquire(&cmOutputConverterIsShellOperator(std::basic_string_view<char,std::char_traits<char>>)
                                 ::shellOperators);
    if (iVar4 != 0) {
      memcpy(local_f0,&DAT_0085fa28,0xc0);
      __a = &local_102;
      __l._M_len = 0xc;
      __l._M_array = local_f0;
      std::
      set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)cmOutputConverterIsShellOperator(std::basic_string_view<char,std::char_traits<char>>)
               ::shellOperators,__l,&local_101,__a);
      flags = (int)__a;
      __cxa_atexit(std::
                   set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::~set,cmOutputConverterIsShellOperator(std::basic_string_view<char,std::char_traits<char>>)
                          ::shellOperators,&__dso_handle);
      __cxa_guard_release(&cmOutputConverterIsShellOperator(std::basic_string_view<char,std::char_traits<char>>)
                           ::shellOperators);
    }
  }
  cVar5 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)cmOutputConverterIsShellOperator(std::basic_string_view<char,std::char_traits<char>>)
                    ::shellOperators,&local_100);
  if (cVar5._M_node ==
      (_Base_ptr)
      (cmOutputConverterIsShellOperator(std::basic_string_view<char,std::char_traits<char>>)::
       shellOperators + 8)) {
    pcVar6 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar2 = cmState::UseWindowsVSIDE(pcVar6);
    uVar3 = 2;
    if (!bVar2) {
      uVar3 = this->LinkScriptShell ^ 1;
    }
    uVar1 = uVar3 + 0x200;
    if (!unescapeNinjaConfiguration) {
      uVar1 = uVar3;
    }
    uVar3 = uVar1 | 0x40;
    if (!makeVars) {
      uVar3 = uVar1;
    }
    uVar1 = uVar3 | 4;
    if (!forEcho) {
      uVar1 = uVar3;
    }
    uVar3 = uVar1 | 0x80;
    if (!useWatcomQuote) {
      uVar3 = uVar1;
    }
    uVar1 = uVar3 | 0x400;
    if (!forResponse) {
      uVar1 = uVar3;
    }
    pcVar6 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar2 = cmState::UseWatcomWMake(pcVar6);
    uVar3 = uVar1 | 8;
    if (!bVar2) {
      uVar3 = uVar1;
    }
    pcVar6 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar2 = cmState::UseMinGWMake(pcVar6);
    uVar1 = uVar3 | 0x10;
    if (!bVar2) {
      uVar1 = uVar3;
    }
    pcVar6 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar2 = cmState::UseNMake(pcVar6);
    uVar3 = uVar1 | 0x20;
    if (!bVar2) {
      uVar3 = uVar1;
    }
    pcVar6 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar2 = cmState::UseWindowsShell(pcVar6);
    uVar1 = uVar3 | 0x100;
    if (bVar2) {
      uVar1 = uVar3;
    }
    in._M_str._0_4_ = uVar1;
    in._M_len = (size_t)pcVar7;
    in._M_str._4_4_ = 0;
    Shell_GetArgument_abi_cxx11_(__return_storage_ptr__,this_00,in,flags);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar7,pcVar7 + (long)&this_00->StateSnapshot);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::EscapeForShell(cm::string_view str,
                                              bool makeVars, bool forEcho,
                                              bool useWatcomQuote,
                                              bool unescapeNinjaConfiguration,
                                              bool forResponse) const
{
  // Do not escape shell operators.
  if (cmOutputConverterIsShellOperator(str)) {
    return std::string(str);
  }

  // Compute the flags for the target shell environment.
  int flags = 0;
  if (this->GetState()->UseWindowsVSIDE()) {
    flags |= Shell_Flag_VSIDE;
  } else if (!this->LinkScriptShell) {
    flags |= Shell_Flag_Make;
  }
  if (unescapeNinjaConfiguration) {
    flags |= Shell_Flag_UnescapeNinjaConfiguration;
  }
  if (makeVars) {
    flags |= Shell_Flag_AllowMakeVariables;
  }
  if (forEcho) {
    flags |= Shell_Flag_EchoWindows;
  }
  if (useWatcomQuote) {
    flags |= Shell_Flag_WatcomQuote;
  }
  if (forResponse) {
    flags |= Shell_Flag_IsResponse;
  }
  if (this->GetState()->UseWatcomWMake()) {
    flags |= Shell_Flag_WatcomWMake;
  }
  if (this->GetState()->UseMinGWMake()) {
    flags |= Shell_Flag_MinGWMake;
  }
  if (this->GetState()->UseNMake()) {
    flags |= Shell_Flag_NMake;
  }
  if (!this->GetState()->UseWindowsShell()) {
    flags |= Shell_Flag_IsUnix;
  }

  return Shell_GetArgument(str, flags);
}